

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

char * __thiscall cs_impl::system_cs_ext::getenv(system_cs_ext *this,char *__name)

{
  char *pcVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = ::getenv(*(char **)__name);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)this,pcVar1,(allocator *)&local_38);
    return (char *)this;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  std::operator+(&local_38,"Environment variable \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
  std::operator+(&local_58,&local_38,"\" is not exist.");
  *plVar2 = (long)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    *(undefined4 *)(plVar2 + 2) = local_58.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)plVar2 + 0x14) = local_58.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(plVar2 + 3) = local_58.field_2._8_4_;
    *(undefined4 *)((long)plVar2 + 0x1c) = local_58.field_2._12_4_;
  }
  else {
    *plVar2 = (long)local_58._M_dataplus._M_p;
    plVar2[2] = CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                         local_58.field_2._M_allocated_capacity._0_4_);
  }
  plVar2[1] = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity._0_4_ =
       local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

string getenv(const string &name)
		{
			const char *str = std::getenv(name.c_str());
			if (str == nullptr)
				throw lang_error("Environment variable \"" + name + "\" is not exist.");
			return str;
		}